

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelationship::~IfcRelationship(IfcRelationship *this,void **vtt)

{
  void **vtt_local;
  IfcRelationship *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelationship,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelationship,_0UL> *)
             &(this->super_IfcRoot).field_0x88,vtt + 5);
  IfcRoot::~IfcRoot(&this->super_IfcRoot,vtt + 1);
  return;
}

Assistant:

IfcRelationship() : Object("IfcRelationship") {}